

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,uint32_t n)

{
  undefined8 in_RDI;
  VmaStringBuilder *unaff_retaddr;
  
  VmaStringBuilder::AddNumber(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void VmaJsonWriter::ContinueString(uint32_t n)
{
    VMA_ASSERT(m_InsideString);
    m_SB.AddNumber(n);
}